

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

int gobj_shouldvis(t_gobj *x,_glist *glist)

{
  int iVar1;
  int iVar2;
  t_object *ptVar3;
  bool local_53;
  bool local_52;
  byte local_51;
  int local_4c;
  int m;
  int gy2;
  int gx2;
  int gy1;
  int gx1;
  int y2;
  int x2;
  int y1;
  int x1;
  int has_parent;
  t_object *ob;
  _glist *glist_local;
  t_gobj *x_local;
  
  local_51 = 0;
  if ((((*(ushort *)&glist->field_0xe8 & 1) == 0) &&
      (local_51 = 0, (*(ushort *)&glist->field_0xe8 >> 8 & 1) != 0)) &&
     (local_51 = 0, glist->gl_owner != (_glist *)0x0)) {
    local_51 = (*(ushort *)&glist->field_0xe8 >> 0xb & 1) != 0 ^ 0xff;
  }
  y1 = (int)(local_51 & 1);
  ob = &glist->gl_obj;
  glist_local = (_glist *)x;
  if ((y1 != 0) && (iVar2 = gobj_shouldvis((t_gobj *)glist,glist->gl_owner), iVar2 == 0)) {
    return 0;
  }
  if ((y1 != 0) && (((ushort)ob[4].te_xpix >> 7 & 1) != 0)) {
    if (((glist_local->gl_obj).te_g.g_pd == scalar_class) ||
       ((glist_local->gl_obj).te_g.g_pd == garray_class)) {
      return 1;
    }
    gobj_getrect(&ob->te_g,(_glist *)ob[1].te_outlet,&x2,&y2,&gx1,&gy1);
    iVar1 = x2;
    iVar2 = y2;
    if (gx1 < x2) {
      x2 = gx1;
      gx1 = iVar1;
    }
    if (gy1 < y2) {
      y2 = gy1;
      gy1 = iVar2;
    }
    gobj_getrect((t_gobj *)glist_local,(_glist *)ob,&gx2,&gy2,&m,&local_4c);
    if (((((gx2 < x2) || (gx1 < gx2)) || (m < x2)) || ((gx1 < m || (gy2 < y2)))) ||
       ((gy1 < gy2 || ((local_4c < y2 || (gy1 < local_4c)))))) {
      return 0;
    }
  }
  ptVar3 = pd_checkobject((t_pd *)glist_local);
  if (ptVar3 == (t_object *)0x0) {
    x_local._4_4_ = 1;
  }
  else {
    local_52 = true;
    if ((((ob[4].te_xpix & 1U) == 0) &&
        (((ptVar3->te_g).g_pd == canvas_class ||
         (local_52 = true, ((ptVar3->te_g).g_pd)->c_wb == &text_widgetbehavior)))) &&
       (((ptVar3->te_g).g_pd != canvas_class ||
        (local_52 = true, ((ushort)ptVar3[4].te_xpix >> 8 & 1) == 0)))) {
      local_53 = false;
      if (((ushort)ob[4].te_xpix >> 7 & 1) != 0) {
        local_53 = (ptVar3->field_0x2e & 3) == 0;
      }
      local_52 = local_53;
    }
    x_local._4_4_ = (uint)local_52;
  }
  return x_local._4_4_;
}

Assistant:

int gobj_shouldvis(t_gobj *x, struct _glist *glist)
{
    t_object *ob;
    int has_parent = !glist->gl_havewindow && glist->gl_isgraph
        && glist->gl_owner && !glist->gl_isclone;
        /* if our parent is a graph, and if that graph itself isn't
           visible, then we aren't either. */
    if (has_parent && !gobj_shouldvis(&glist->gl_gobj, glist->gl_owner))
            return (0);
        /* if we're graphing-on-parent and the object falls outside the
           graph rectangle, don't draw it. */
    if (has_parent && glist->gl_goprect)
    {
        int x1, y1, x2, y2, gx1, gy1, gx2, gy2, m;
            /* for some reason the bounds check on arrays and scalars
               don't seem to apply here.  Perhaps this was in order to allow
               arrays to reach outside their containers?  I no longer understand
               this. */
        if (pd_class(&x->g_pd) == scalar_class
            || pd_class(&x->g_pd) == garray_class)
                return (1);
        gobj_getrect(&glist->gl_gobj, glist->gl_owner, &x1, &y1, &x2, &y2);
        if (x1 > x2)
            m = x1, x1 = x2, x2 = m;
        if (y1 > y2)
            m = y1, y1 = y2, y2 = m;
        gobj_getrect(x, glist, &gx1, &gy1, &gx2, &gy2);
#if 0
        post("graph %d %d %d %d, %s %d %d %d %d",
             x1, x2, y1, y2, class_gethelpname(x->g_pd), gx1, gx2, gy1, gy2);
#endif
        if (gx1 < x1 || gx1 > x2 || gx2 < x1 || gx2 > x2 ||
            gy1 < y1 || gy1 > y2 || gy2 < y1 || gy2 > y2)
                return (0);
    }
    if ((ob = pd_checkobject(&x->g_pd)))
    {
            /* return true if the text box should be drawn.  We don't show text
               boxes inside graphs---except comments, if we're doing the new
               (goprect) style. */
        return (glist->gl_havewindow ||
            (ob->te_pd != canvas_class &&
                ob->te_pd->c_wb != &text_widgetbehavior) ||
            (ob->te_pd == canvas_class && (((t_glist *)ob)->gl_isgraph)) ||
            (glist->gl_goprect && (ob->te_type == T_TEXT)));
    }
    else return (1);
}